

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O3

void cpp_wrapper_all_records
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int *expected_records,
               int expected_num_records,ion_boolean_t records_exist)

{
  ulong uVar1;
  byte bVar2;
  planck_unit_result_t pVar3;
  ion_cursor_status_t iVar4;
  char cVar5;
  Cursor<int,_int> *this;
  ulong uVar6;
  ion_record_t *piVar7;
  long lVar8;
  int local_5c;
  ulong local_48;
  
  this = Dictionary<int,_int>::allRecords(dict);
  bVar2 = this->cursor->status - 2;
  if (records_exist == '\0') {
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((bVar2 & 0xfd) != 0),0xdd,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar3 == '\0') goto LAB_00108a7b;
    iVar4 = (*this->cursor->next)(this->cursor,&this->record);
    cVar5 = planck_unit_assert_true
                      (tc,(uint)((iVar4 - 2U & 0xfd) != 0),0xde,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
  }
  else {
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((bVar2 & 0xfd) == 0),0xe5,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00108a7b;
    piVar7 = &this->record;
    iVar4 = (*this->cursor->next)(this->cursor,piVar7);
    if ((iVar4 == '\x04') || (local_5c = 0, iVar4 == '\x02')) {
      local_48 = 0;
      local_5c = 0;
      do {
        uVar1 = local_48;
        if (0 < expected_num_records) {
          uVar6 = 0;
          do {
            uVar1 = uVar6;
            if (expected_records[uVar6] == *piVar7->key) break;
            uVar6 = uVar6 + 1;
            uVar1 = local_48;
          } while ((uint)expected_num_records != uVar6);
        }
        local_48 = uVar1;
        lVar8 = (long)(int)local_48;
        pVar3 = planck_unit_assert_int_are_equal
                          (tc,expected_records[lVar8],*piVar7->key,0xf4,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                          );
        if ((pVar3 == '\0') ||
           (pVar3 = planck_unit_assert_int_are_equal
                              (tc,expected_records[lVar8],*(this->record).value,0xf5,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                              ), pVar3 == '\0')) goto LAB_00108a7b;
        expected_records[lVar8] = 999;
        iVar4 = (*this->cursor->next)(this->cursor,piVar7);
        local_5c = local_5c + 1;
      } while ((iVar4 == '\x02') || (iVar4 == '\x04'));
    }
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((this->cursor->status - 2U & 0xfd) != 0),0xfc,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar3 == '\0') goto LAB_00108a7b;
    cVar5 = planck_unit_assert_int_are_equal
                      (tc,expected_num_records,local_5c,0xff,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
  }
  if (cVar5 != '\0') {
    Cursor<int,_int>::~Cursor(this);
    operator_delete(this);
    return;
  }
LAB_00108a7b:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_all_records(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int expected_records[],
	int expected_num_records,
	ion_boolean_t records_exist
) {
	Cursor<int, int> *cursor = dict->allRecords();

	if (!records_exist) {
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->next());

		delete cursor;

		return;
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, cursor->hasNext());

	int records_found			= 0;
	int curr_pos				= 0;

	ion_cursor_status_t status	= cursor->next();

	while (status) {
		for (int i = 0; i < expected_num_records; i++) {
			if (expected_records[i] == cursor->getKey()) {
				curr_pos = i;
				break;
			}
		}

		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getKey());
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getValue());

		expected_records[curr_pos]	= NULL_VALUE;
		status						= cursor->next();
		records_found++;
	}

	PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());

	/* Check that same number of records are found as were inserted with desired key. */
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_num_records, records_found);

	delete cursor;
}